

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void analysis_53_col(int length,tran_low_t *x,tran_low_t *lowpass,tran_low_t *highpass)

{
  int iVar1;
  tran_low_t *b;
  tran_low_t *a;
  tran_low_t r;
  int n;
  tran_low_t *highpass_local;
  tran_low_t *lowpass_local;
  tran_low_t *x_local;
  int length_local;
  
  b = highpass;
  a = lowpass;
  n = length >> 1;
  x_local = x;
  while (n = n + -1, n != 0) {
    iVar1 = *x_local;
    *a = iVar1;
    *b = (x_local[1] * 2 - (iVar1 + x_local[2])) + 2 >> 2;
    x_local = x_local + 2;
    b = b + 1;
    a = a + 1;
  }
  iVar1 = *x_local;
  *a = iVar1;
  *b = (x_local[1] - iVar1) + 1 >> 1;
  r = *highpass;
  b = highpass;
  a = lowpass;
  n = length >> 1;
  while (n != 0) {
    *a = (r + *b + 1 >> 1) + *a;
    r = *b;
    b = b + 1;
    a = a + 1;
    n = n + -1;
  }
  return;
}

Assistant:

static void analysis_53_col(int length, tran_low_t *x, tran_low_t *lowpass,
                            tran_low_t *highpass) {
  int n;
  tran_low_t r, *a, *b;

  n = length >> 1;
  b = highpass;
  a = lowpass;
  while (--n) {
    *a++ = (r = *x++);
    *b++ = (((*x) * 2) - (r + x[1]) + 2) >> 2;
    x++;
  }
  *a = (r = *x++);
  *b = (*x - r + 1) >> 1;

  n = length >> 1;
  b = highpass;
  a = lowpass;
  r = *highpass;
  while (n--) {
    *a++ += (r + (*b) + 1) >> 1;
    r = *b++;
  }
}